

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

VariableNT __thiscall
adios2::IO::DefineVariable
          (IO *this,DataType type,string *name,Dims *shape,Dims *start,Dims *count,bool constantDims
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IO *pointer;
  int iVar2;
  long *plVar3;
  Variable *variable;
  size_type *psVar4;
  bool bVar5;
  VariableNT local_b0;
  Dims *local_a8;
  vector *local_a0;
  vector *local_98;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pointer = this->m_IO;
  local_a0 = (vector *)shape;
  local_98 = (vector *)start;
  std::operator+(&local_70,"for variable name ",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_8_ = plVar3[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_50._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_50);
  local_a8 = count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  adios2::ToString_abi_cxx11_((DataType)&local_70);
  GetType<std::__cxx11::string>();
  if (local_70._M_string_length == local_88) {
    if (local_70._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar5) {
    variable = adios2::core::IO::DefineVariable<std::__cxx11::string>
                         ((string *)this->m_IO,(vector *)name,local_a0,local_98,SUB81(local_a8,0));
  }
  else {
    adios2::ToString_abi_cxx11_((DataType)&local_70);
    GetType<char>();
    if (local_70._M_string_length == local_88) {
      if (local_70._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar5) {
      variable = adios2::core::IO::DefineVariable<char>
                           ((string *)this->m_IO,(vector *)name,local_a0,local_98,SUB81(local_a8,0))
      ;
    }
    else {
      adios2::ToString_abi_cxx11_((DataType)&local_70);
      GetType<signed_char>();
      if (local_70._M_string_length == local_88) {
        if (local_70._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
          bVar5 = iVar2 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar5) {
        variable = adios2::core::IO::DefineVariable<signed_char>
                             ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                              SUB81(local_a8,0));
      }
      else {
        adios2::ToString_abi_cxx11_((DataType)&local_70);
        GetType<short>();
        if (local_70._M_string_length == local_88) {
          if (local_70._M_string_length == 0) {
            bVar5 = true;
          }
          else {
            iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
            bVar5 = iVar2 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar5) {
          variable = adios2::core::IO::DefineVariable<short>
                               ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                SUB81(local_a8,0));
        }
        else {
          adios2::ToString_abi_cxx11_((DataType)&local_70);
          GetType<int>();
          if (local_70._M_string_length == local_88) {
            if (local_70._M_string_length == 0) {
              bVar5 = true;
            }
            else {
              iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
              bVar5 = iVar2 == 0;
            }
          }
          else {
            bVar5 = false;
          }
          if (local_90 != local_80) {
            operator_delete(local_90);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (bVar5) {
            variable = adios2::core::IO::DefineVariable<int>
                                 ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                  SUB81(local_a8,0));
          }
          else {
            adios2::ToString_abi_cxx11_((DataType)&local_70);
            GetType<long>();
            if (local_70._M_string_length == local_88) {
              if (local_70._M_string_length == 0) {
                bVar5 = true;
              }
              else {
                iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                bVar5 = iVar2 == 0;
              }
            }
            else {
              bVar5 = false;
            }
            if (local_90 != local_80) {
              operator_delete(local_90);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (bVar5) {
              variable = adios2::core::IO::DefineVariable<long>
                                   ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                    SUB81(local_a8,0));
            }
            else {
              adios2::ToString_abi_cxx11_((DataType)&local_70);
              GetType<unsigned_char>();
              if (local_70._M_string_length == local_88) {
                if (local_70._M_string_length == 0) {
                  bVar5 = true;
                }
                else {
                  iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                  bVar5 = iVar2 == 0;
                }
              }
              else {
                bVar5 = false;
              }
              if (local_90 != local_80) {
                operator_delete(local_90);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != paVar1) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if (bVar5) {
                variable = adios2::core::IO::DefineVariable<unsigned_char>
                                     ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                      SUB81(local_a8,0));
              }
              else {
                adios2::ToString_abi_cxx11_((DataType)&local_70);
                GetType<unsigned_short>();
                if (local_70._M_string_length == local_88) {
                  if (local_70._M_string_length == 0) {
                    bVar5 = true;
                  }
                  else {
                    iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                    bVar5 = iVar2 == 0;
                  }
                }
                else {
                  bVar5 = false;
                }
                if (local_90 != local_80) {
                  operator_delete(local_90);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != paVar1) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
                if (bVar5) {
                  variable = adios2::core::IO::DefineVariable<unsigned_short>
                                       ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                        SUB81(local_a8,0));
                }
                else {
                  adios2::ToString_abi_cxx11_((DataType)&local_70);
                  GetType<unsigned_int>();
                  if (local_70._M_string_length == local_88) {
                    if (local_70._M_string_length == 0) {
                      bVar5 = true;
                    }
                    else {
                      iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                      bVar5 = iVar2 == 0;
                    }
                  }
                  else {
                    bVar5 = false;
                  }
                  if (local_90 != local_80) {
                    operator_delete(local_90);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != paVar1) {
                    operator_delete(local_70._M_dataplus._M_p);
                  }
                  if (bVar5) {
                    variable = adios2::core::IO::DefineVariable<unsigned_int>
                                         ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                          SUB81(local_a8,0));
                  }
                  else {
                    adios2::ToString_abi_cxx11_((DataType)&local_70);
                    GetType<unsigned_long>();
                    if (local_70._M_string_length == local_88) {
                      if (local_70._M_string_length == 0) {
                        bVar5 = true;
                      }
                      else {
                        iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                        bVar5 = iVar2 == 0;
                      }
                    }
                    else {
                      bVar5 = false;
                    }
                    if (local_90 != local_80) {
                      operator_delete(local_90);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != paVar1) {
                      operator_delete(local_70._M_dataplus._M_p);
                    }
                    if (bVar5) {
                      variable = adios2::core::IO::DefineVariable<unsigned_long>
                                           ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                            SUB81(local_a8,0));
                    }
                    else {
                      adios2::ToString_abi_cxx11_((DataType)&local_70);
                      GetType<float>();
                      if (local_70._M_string_length == local_88) {
                        if (local_70._M_string_length == 0) {
                          bVar5 = true;
                        }
                        else {
                          iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length)
                          ;
                          bVar5 = iVar2 == 0;
                        }
                      }
                      else {
                        bVar5 = false;
                      }
                      if (local_90 != local_80) {
                        operator_delete(local_90);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != paVar1) {
                        operator_delete(local_70._M_dataplus._M_p);
                      }
                      if (bVar5) {
                        variable = adios2::core::IO::DefineVariable<float>
                                             ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                              SUB81(local_a8,0));
                      }
                      else {
                        adios2::ToString_abi_cxx11_((DataType)&local_70);
                        GetType<double>();
                        if (local_70._M_string_length == local_88) {
                          if (local_70._M_string_length == 0) {
                            bVar5 = true;
                          }
                          else {
                            iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,
                                         local_70._M_string_length);
                            bVar5 = iVar2 == 0;
                          }
                        }
                        else {
                          bVar5 = false;
                        }
                        if (local_90 != local_80) {
                          operator_delete(local_90);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_70._M_dataplus._M_p != paVar1) {
                          operator_delete(local_70._M_dataplus._M_p);
                        }
                        if (bVar5) {
                          variable = adios2::core::IO::DefineVariable<double>
                                               ((string *)this->m_IO,(vector *)name,local_a0,
                                                local_98,SUB81(local_a8,0));
                        }
                        else {
                          adios2::ToString_abi_cxx11_((DataType)&local_70);
                          GetType<long_double>();
                          if (local_70._M_string_length == local_88) {
                            if (local_70._M_string_length == 0) {
                              bVar5 = true;
                            }
                            else {
                              iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,
                                           local_70._M_string_length);
                              bVar5 = iVar2 == 0;
                            }
                          }
                          else {
                            bVar5 = false;
                          }
                          if (local_90 != local_80) {
                            operator_delete(local_90);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_70._M_dataplus._M_p != paVar1) {
                            operator_delete(local_70._M_dataplus._M_p);
                          }
                          if (bVar5) {
                            variable = adios2::core::IO::DefineVariable<long_double>
                                                 ((string *)this->m_IO,(vector *)name,local_a0,
                                                  local_98,SUB81(local_a8,0));
                          }
                          else {
                            adios2::ToString_abi_cxx11_((DataType)&local_70);
                            GetType<std::complex<float>>();
                            if (local_70._M_string_length == local_88) {
                              if (local_70._M_string_length == 0) {
                                bVar5 = true;
                              }
                              else {
                                iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,
                                             local_70._M_string_length);
                                bVar5 = iVar2 == 0;
                              }
                            }
                            else {
                              bVar5 = false;
                            }
                            if (local_90 != local_80) {
                              operator_delete(local_90);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_70._M_dataplus._M_p != paVar1) {
                              operator_delete(local_70._M_dataplus._M_p);
                            }
                            if (bVar5) {
                              variable = adios2::core::IO::DefineVariable<std::complex<float>>
                                                   ((string *)this->m_IO,(vector *)name,local_a0,
                                                    local_98,SUB81(local_a8,0));
                            }
                            else {
                              adios2::ToString_abi_cxx11_((DataType)&local_70);
                              GetType<std::complex<double>>();
                              if (local_70._M_string_length == local_88) {
                                if (local_70._M_string_length == 0) {
                                  bVar5 = true;
                                }
                                else {
                                  iVar2 = bcmp(local_70._M_dataplus._M_p,local_90,
                                               local_70._M_string_length);
                                  bVar5 = iVar2 == 0;
                                }
                              }
                              else {
                                bVar5 = false;
                              }
                              if (local_90 != local_80) {
                                operator_delete(local_90);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_70._M_dataplus._M_p != paVar1) {
                                operator_delete(local_70._M_dataplus._M_p);
                              }
                              if (bVar5) {
                                variable = adios2::core::IO::DefineVariable<std::complex<double>>
                                                     ((string *)this->m_IO,(vector *)name,local_a0,
                                                      local_98,SUB81(local_a8,0));
                              }
                              else {
                                variable = (Variable *)0x0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  VariableNT::VariableNT(&local_b0,(VariableBase *)variable);
  return (VariableNT)local_b0.m_Variable;
}

Assistant:

VariableNT IO::DefineVariable(const DataType type, const std::string &name, const Dims &shape,
                              const Dims &start, const Dims &count, const bool constantDims)
{
    helper::CheckForNullptr(m_IO, "for variable name " + name + ", in call to IO::DefineVariable");
#define declare_type(T)                                                                            \
    if (ToString(type) == GetType<T>())                                                            \
    {                                                                                              \
        return VariableNT(&m_IO->DefineVariable<typename TypeInfo<T>::IOType>(                     \
            name, shape, start, count, constantDims));                                             \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else
    {
        return nullptr;
    }
}